

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatictext.cpp
# Opt level: O2

bool __thiscall QStaticText::operator==(QStaticText *this,QStaticText *other)

{
  QStaticTextPrivate *pQVar1;
  QStaticTextPrivate *pQVar2;
  bool bVar3;
  
  pQVar1 = (other->data).d.ptr;
  pQVar2 = (this->data).d.ptr;
  if (pQVar2 == pQVar1) {
    bVar3 = true;
  }
  else {
    bVar3 = ::comparesEqual(&pQVar2->text,&pQVar1->text);
    if ((bVar3) &&
       (bVar3 = QFont::operator==(&((this->data).d.ptr)->font,&((other->data).d.ptr)->font), bVar3))
    {
      return (bool)(-(((other->data).d.ptr)->textWidth == ((this->data).d.ptr)->textWidth) & 1);
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool QStaticText::operator==(const QStaticText &other) const
{
    return (data == other.data
            || (data->text == other.data->text
                && data->font == other.data->font
                && data->textWidth == other.data->textWidth));
}